

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O2

Vector __thiscall
anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::point_at
          (Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this,double u,double v)

{
  double extraout_XMM0_Qa;
  Pointer<anurbs::NurbsSurfaceGeometry<2L>_> PVar1;
  Vector VVar2;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> local_20;
  
  PVar1 = Ref<anurbs::NurbsSurfaceGeometry<2L>_>::data(&local_20);
  (*((local_20.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_EntryBase)._vptr_EntryBase[6])
            (u,this,local_20.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,
             PVar1.super___shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] = v;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0] =
       extraout_XMM0_Qa;
  return (Vector)VVar2.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                 .array;
}

Assistant:

Vector point_at(const double u, const double v) const override
    {
        return m_surface_geometry->point_at(u, v);
    }